

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall gvr::anon_unknown_3::PLYProperty::PLYProperty(PLYProperty *this,PLYProperty *p)

{
  PLYValue *pPVar1;
  void *pvVar2;
  PLYValueList *in_RSI;
  undefined4 *in_RDI;
  ply_encoding in_stack_00000088;
  ply_type in_stack_0000008c;
  ply_encoding in_stack_ffffffffffffffe4;
  ply_type in_stack_ffffffffffffffe8;
  ply_type in_stack_ffffffffffffffec;
  
  *in_RDI = *(undefined4 *)&(in_RSI->super_PLYValue)._vptr_PLYValue;
  std::__cxx11::string::string((string *)(in_RDI + 2),(string *)&in_RSI->enc);
  in_RDI[10] = *(undefined4 *)
                &(in_RSI->list).
                 super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  in_RDI[0xb] = *(undefined4 *)
                 ((long)&(in_RSI->list).
                         super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + 4);
  if (in_RDI[10] == 0) {
    pPVar1 = createValue(in_stack_0000008c,in_stack_00000088);
    *(PLYValue **)(in_RDI + 0xc) = pPVar1;
  }
  else {
    pvVar2 = operator_new(0x40);
    PLYValueList::PLYValueList
              (in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4)
    ;
    *(void **)(in_RDI + 0xc) = pvVar2;
  }
  *(undefined8 *)(in_RDI + 0xe) = 0;
  return;
}

Assistant:

PLYProperty::PLYProperty(const PLYProperty &p): enc(p.enc), name(p.name)
{
  tsize=p.tsize;
  tvalue=p.tvalue;

  if (tsize == ply_none)
  {
    value=createValue(tvalue, enc);
  }
  else
  {
    value=new PLYValueList(tsize, tvalue, enc);
  }

  receiver=0;
}